

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O2

int erkStep_SetDefaults(ARKodeMem ark_mem)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  
  iVar2 = erkStep_AccessStepMem(ark_mem,"erkStep_SetDefaults",&step_mem);
  if (iVar2 == 0) {
    step_mem->q = 4;
    step_mem->p = 0;
    step_mem->stages = 0;
    pAVar1 = ark_mem->hadapt_mem;
    pAVar1->etamxf = 0.3;
    pAVar1->safety = 0.99;
    pAVar1->growth = 25.0;
    if (step_mem->B != (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Space(step_mem->B,&Bliw,&Blrw);
      ark_mem->liw = ark_mem->liw - Bliw;
      ark_mem->lrw = ark_mem->lrw - Blrw;
      ARKodeButcherTable_Free(step_mem->B);
    }
    step_mem->B = (ARKodeButcherTable)0x0;
    iVar2 = arkReplaceAdaptController(ark_mem,(SUNAdaptController)0x0,1);
  }
  return iVar2;
}

Assistant:

int erkStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q      = Q_DEFAULT;                  /* method order */
  step_mem->p      = 0;                          /* embedding order */
  step_mem->stages = 0;                          /* no stages */
  ark_mem->hadapt_mem->etamxf = SUN_RCONST(0.3); /* max change on error-failed step */
  ark_mem->hadapt_mem->safety = SUN_RCONST(0.99); /* step adaptivity safety factor  */
  ark_mem->hadapt_mem->growth = SUN_RCONST(25.0); /* step adaptivity growth factor */

  /* Remove pre-existing Butcher table */
  if (step_mem->B)
  {
    ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
    ark_mem->liw -= Bliw;
    ark_mem->lrw -= Blrw;
    ARKodeButcherTable_Free(step_mem->B);
  }
  step_mem->B = NULL;

  /* Load the default SUNAdaptController */
  retval = arkReplaceAdaptController(ark_mem, NULL, SUNTRUE);
  if (retval) { return retval; }

  return (ARK_SUCCESS);
}